

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O3

void __thiscall DetectorSS::Merge(DetectorSS *this,DetectorSS *detector)

{
  byte *pbVar1;
  uchar **ppuVar2;
  key_tp **ppkVar3;
  int **ppiVar4;
  uchar *puVar5;
  uchar *puVar6;
  int *piVar7;
  int *piVar8;
  uint uVar9;
  DetectorSS *ss;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  
  iVar11 = (this->ss_).depth;
  if (0 < iVar11) {
    ppuVar2 = (detector->ss_).counts;
    ppkVar3 = (detector->ss_).skey;
    ppiVar4 = (detector->ss_).level;
    uVar13 = (ulong)(uint)(this->ss_).width;
    lVar10 = 0;
    do {
      if (0 < (int)uVar13) {
        lVar12 = 0;
        do {
          iVar11 = (this->ss_).offsets[(this->ss_).c];
          if (0 < iVar11) {
            puVar5 = (this->ss_).counts[lVar10];
            puVar6 = ppuVar2[lVar10];
            iVar15 = 0;
            do {
              uVar9 = iVar15 + iVar11 * (int)lVar12;
              iVar14 = (int)uVar9 >> 3;
              uVar9 = uVar9 & 7;
              pbVar1 = puVar5 + iVar14;
              *pbVar1 = *pbVar1 | (byte)(0xff >> uVar9) & puVar6[iVar14];
              iVar15 = (iVar15 - uVar9) + 8;
            } while (iVar15 < iVar11);
          }
          piVar7 = (this->ss_).level[lVar10];
          piVar8 = ppiVar4[lVar10];
          if (piVar7[lVar12] <= piVar8[lVar12]) {
            (this->ss_).skey[lVar10][lVar12] = ppkVar3[lVar10][lVar12];
            piVar7[lVar12] = piVar8[lVar12];
          }
          lVar12 = lVar12 + 1;
          uVar13 = (ulong)(this->ss_).width;
        } while (lVar12 < (long)uVar13);
        iVar11 = (this->ss_).depth;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar11);
  }
  return;
}

Assistant:

void DetectorSS::Merge(DetectorSS* detector) {
	DetectorSS* ss = (DetectorSS*)detector;
	unsigned char** counts = ss->GetTable();
	key_tp** skey = ss->GetKey();
	int** level = ss->GetLevel();
	for (int i = 0; i < ss_.depth; i++) {
		for (int j = 0; j < ss_.width; j++) {
			Mergebmp(ss_.counts[i], counts[i], j * ss_.offsets[ss_.c], ss_.offsets[ss_.c]);
			if (ss_.level[i][j] <= level[i][j]) {
				ss_.skey[i][j] = skey[i][j];
				ss_.level[i][j] = level[i][j];
			}
		}
	}
}